

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O3

RunnerContext * GetNextContext(Runner *runner)

{
  _Bool *p_Var1;
  long lVar2;
  
  if (0 < (long)runner->totalContexts) {
    p_Var1 = runner->contextUsed;
    lVar2 = 0;
    do {
      if (*p_Var1 == false) {
        *p_Var1 = true;
        return (RunnerContext *)((long)runner->contexts - lVar2);
      }
      p_Var1 = p_Var1 + 1;
      lVar2 = lVar2 + -0x18;
    } while ((long)runner->totalContexts * 0x18 + lVar2 != 0);
  }
  puts("Ran out of contexts");
  exit(0);
}

Assistant:

RunnerContext* GetNextContext(Runner* runner) {
  for (int i = 0; i < runner->totalContexts; i++) {
    if (!runner->contextUsed[i]) {
      runner->contextUsed[i] = true;
      return &runner->contexts[i];  
    }
  }

  RUNTIME_ERROR("Ran out of contexts");
}